

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS ref_recon_local_immediate_cloud_geom(REF_CLOUD *one_layer,REF_GRID ref_grid,REF_INT id)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_INT local_b4;
  REF_DBL local_a0;
  REF_INT local_98;
  int local_94;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL xyzs [4];
  REF_GLOB global;
  REF_INT geom;
  REF_INT target;
  REF_INT cell_node;
  REF_INT cell;
  REF_INT item;
  REF_INT node;
  REF_FACELIFT ref_facelift;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID pRStack_20;
  REF_INT id_local;
  REF_GRID ref_grid_local;
  REF_CLOUD *one_layer_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  ref_geom = (REF_GEOM)ref_grid->cell[3];
  ref_facelift = (REF_FACELIFT)ref_grid->geom;
  _item = ((REF_GEOM)ref_facelift)->ref_facelift;
  cell = 0;
  ref_node._4_4_ = id;
  pRStack_20 = ref_grid;
  ref_grid_local = (REF_GRID)one_layer;
  do {
    if (ref_cell->last_node_is_an_id <= cell) {
      return 0;
    }
    if ((((-1 < cell) && (cell < ref_cell->last_node_is_an_id)) &&
        (-1 < *(long *)(*(long *)&ref_cell->edge_per + (long)cell * 8))) &&
       (*(int *)(*(long *)&ref_cell[1].size_per + 4) ==
        *(int *)(*(long *)&ref_cell->n + (long)cell * 4))) {
      if ((cell < 0) || (*(int *)ref_geom->segments_per_radian_of_curvature <= cell)) {
        local_94 = -1;
      }
      else {
        local_94 = *(int *)(*(long *)((long)ref_geom->segments_per_radian_of_curvature + 8) +
                           (long)cell * 4);
      }
      cell_node = local_94;
      if (local_94 == -1) {
        local_98 = -1;
      }
      else {
        local_98 = *(REF_INT *)
                    (*(long *)((long)ref_geom->segments_per_radian_of_curvature + 0x10) + 4 +
                    (long)local_94 * 8);
      }
      target = local_98;
      while (cell_node != -1) {
        if (ref_node._4_4_ ==
            *(int *)((long)ref_geom->face_seg_per_rad +
                    (long)(*(int *)&ref_geom->field_0xc + ref_geom->blank * target) * 4)) {
          for (geom = 0; geom < *(int *)&ref_geom->field_0xc; geom = geom + 1) {
            global._4_4_ = *(int *)((long)ref_geom->face_seg_per_rad +
                                   (long)(geom + ref_geom->blank * target) * 4);
            if (((global._4_4_ < 0) || (ref_cell->last_node_is_an_id <= global._4_4_)) ||
               (*(long *)(*(long *)&ref_cell->edge_per + (long)global._4_4_ * 8) < 0)) {
              local_a0 = -NAN;
            }
            else {
              local_a0 = *(REF_DBL *)(*(long *)&ref_cell->edge_per + (long)global._4_4_ * 8);
            }
            xyzs[3] = local_a0;
            _ref_private_macro_code_rss_1 =
                 *(REF_DBL *)(ref_cell->c2n + (long)(global._4_4_ * 0xf) * 2);
            xyzs[0] = *(REF_DBL *)(ref_cell->c2n + (long)(global._4_4_ * 0xf + 1) * 2);
            xyzs[1] = *(REF_DBL *)(ref_cell->c2n + (long)(global._4_4_ * 0xf + 2) * 2);
            uVar1 = ref_geom_find((REF_GEOM)ref_facelift,global._4_4_,2,ref_node._4_4_,
                                  (REF_INT *)&global);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x301,"ref_recon_local_immediate_cloud_geom",(ulong)uVar1,"find geom");
              return uVar1;
            }
            dVar2 = pow(_item->displacement[(int)global * 3],2.0);
            dVar3 = pow(_item->displacement[(int)global * 3 + 1],2.0);
            dVar4 = pow(_item->displacement[(int)global * 3 + 2],2.0);
            xyzs[2] = sqrt(dVar2 + dVar3 + dVar4);
            uVar1 = ref_cloud_store((REF_CLOUD)ref_grid_local->cell[(long)cell + -2],
                                    (REF_GLOB)xyzs[3],(REF_DBL *)&ref_private_macro_code_rss_1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x304,"ref_recon_local_immediate_cloud_geom",(ulong)uVar1,
                     "store could stencil");
              return uVar1;
            }
          }
        }
        cell_node = *(int *)(*(long *)((long)ref_geom->segments_per_radian_of_curvature + 0x10) +
                            (long)cell_node * 8);
        if (cell_node == -1) {
          local_b4 = -1;
        }
        else {
          local_b4 = *(REF_INT *)
                      (*(long *)((long)ref_geom->segments_per_radian_of_curvature + 0x10) + 4 +
                      (long)cell_node * 8);
        }
        target = local_b4;
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_recon_local_immediate_cloud_geom(
    REF_CLOUD *one_layer, REF_GRID ref_grid, REF_INT id) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_FACELIFT ref_facelift = ref_geom_facelift(ref_geom);
  REF_INT node, item, cell, cell_node, target, geom;
  REF_GLOB global;
  REF_DBL xyzs[4];
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      each_ref_cell_having_node(ref_cell, node, item, cell) {
        if (id == ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell)) {
          each_ref_cell_cell_node(ref_cell, cell_node) {
            target = ref_cell_c2n(ref_cell, cell_node, cell);
            global = ref_node_global(ref_node, target);
            xyzs[0] = ref_node_xyz(ref_node, 0, target);
            xyzs[1] = ref_node_xyz(ref_node, 1, target);
            xyzs[2] = ref_node_xyz(ref_node, 2, target);
            RSS(ref_geom_find(ref_geom, target, REF_GEOM_FACE, id, &geom),
                "find geom");
            xyzs[3] = ref_facelift_distance(ref_facelift, geom);
            RSS(ref_cloud_store(one_layer[node], global, xyzs),
                "store could stencil");
          }
        }
      }
    }
  }
  return REF_SUCCESS;
}